

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void sgai_median_patch_values
               (Integer type,Integer ndim,Integer *loA,Integer *hiA,Integer *ldA,void *A_ptr,
               void *B_ptr,void *C_ptr,void *M_ptr,Integer offset)

{
  undefined4 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  float fVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  double dVar31;
  double dVar32;
  Integer baseldA [7];
  Integer bunit [7];
  void *local_168;
  void *local_160;
  void *local_158;
  void *local_150;
  float local_148;
  float fStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  float local_118;
  float fStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  long lStack_f0;
  undefined1 local_e8 [40];
  long local_c0;
  long local_b8;
  double local_b0;
  long local_a8 [8];
  long local_68 [7];
  
  lVar23 = 1;
  if (1 < ndim) {
    lVar16 = 1;
    do {
      lVar23 = lVar23 * ((hiA[lVar16] - loA[lVar16]) + 1);
      lVar16 = lVar16 + 1;
    } while (ndim != lVar16);
  }
  local_158 = M_ptr;
  local_160 = C_ptr;
  local_168 = B_ptr;
  lStack_f0 = 0;
  local_68[0] = 1;
  local_68[1] = 1;
  local_a8[0] = *ldA;
  local_a8[1] = *ldA * ldA[1];
  if (2 < ndim) {
    memset(local_e8,0,ndim * 8 - 0x10);
    lVar17 = 2;
    lVar16 = local_a8[1];
    lVar18 = local_68[1];
    do {
      lVar18 = lVar18 * ((hiA[lVar17 + -1] - loA[lVar17 + -1]) + 1);
      local_68[lVar17] = lVar18;
      lVar16 = lVar16 * ldA[lVar17];
      local_a8[lVar17] = lVar16;
      lVar17 = lVar17 + 1;
    } while (ndim != lVar17);
  }
  local_150 = A_ptr;
  switch(type + -0x3e9) {
  case 0:
  case 2:
    lVar22 = offset * 4;
    lVar16 = offset * 4;
    lVar18 = offset * 4;
    lVar17 = offset * 4;
    break;
  case 1:
  case 3:
  case 5:
  case 0xf:
    lVar22 = offset * 8;
    lVar16 = offset * 8;
    lVar18 = offset * 8;
    lVar17 = offset * 8;
    break;
  default:
    goto switchD_00129707_caseD_4;
  case 6:
    lVar16 = offset * 0x10;
    local_150 = (void *)((long)A_ptr + lVar16);
    local_168 = (void *)((long)B_ptr + lVar16);
    local_160 = (void *)((long)C_ptr + lVar16);
    local_158 = (void *)((long)M_ptr + lVar16);
    goto switchD_00129707_caseD_4;
  }
  local_150 = (void *)((long)A_ptr + lVar22);
  local_160 = (void *)((long)C_ptr + lVar18);
  local_168 = (void *)((long)B_ptr + lVar16);
  local_158 = (void *)((long)M_ptr + lVar17);
switchD_00129707_caseD_4:
  switch(type + -0x3e9) {
  case 0:
    if (0 < lVar23) {
      lVar16 = *hiA;
      lVar18 = *loA;
      lVar17 = 0;
      do {
        if (ndim < 2) {
          lVar22 = 0;
        }
        else {
          lVar20 = 0;
          lVar22 = 0;
          do {
            lVar19 = *(long *)(local_e8 + lVar20 * 8 + -8);
            if ((lVar17 + 1) % local_68[lVar20 + 1] == 0) {
              *(long *)(local_e8 + lVar20 * 8 + -8) = lVar19 + 1;
            }
            lVar22 = lVar22 + lVar19 * local_a8[lVar20];
            lVar19 = 0;
            if (*(long *)(local_e8 + lVar20 * 8 + -8) <= hiA[lVar20 + 1] - loA[lVar20 + 1]) {
              lVar19 = *(long *)(local_e8 + lVar20 * 8 + -8);
            }
            *(long *)(local_e8 + lVar20 * 8 + -8) = lVar19;
            lVar20 = lVar20 + 1;
          } while (ndim + -1 != lVar20);
        }
        if (lVar18 <= lVar16) {
          lVar20 = 0;
          do {
            iVar4 = *(int *)((long)local_150 + lVar20 * 4 + lVar22 * 4);
            iVar5 = *(int *)((long)local_168 + lVar20 * 4 + lVar22 * 4);
            iVar21 = iVar4;
            if (iVar4 != iVar5) {
              iVar6 = *(int *)((long)local_160 + lVar20 * 4 + lVar22 * 4);
              if (iVar4 < iVar5) {
                if ((iVar4 <= iVar6) && (iVar21 = iVar5, iVar6 < iVar5)) {
                  iVar21 = iVar6;
                }
              }
              else if ((iVar4 <= iVar5) || (iVar21 = iVar5, iVar5 <= iVar6)) {
                iVar11 = iVar4;
                if (iVar6 < iVar4) {
                  iVar11 = iVar6;
                }
                iVar21 = iVar4;
                if (iVar5 <= iVar6) {
                  iVar21 = iVar11;
                }
              }
            }
            *(int *)((long)local_158 + lVar20 * 4 + lVar22 * 4) = iVar21;
            lVar20 = lVar20 + 1;
          } while ((lVar16 - lVar18) + 1 != lVar20);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != lVar23);
    }
    break;
  case 1:
    if (0 < lVar23) {
      lVar16 = 0;
      do {
        if (ndim < 2) {
          lVar18 = 0;
        }
        else {
          lVar17 = 0;
          lVar18 = 0;
          do {
            lVar22 = *(long *)(local_e8 + lVar17 * 8 + -8);
            if ((lVar16 + 1) % local_68[lVar17 + 1] == 0) {
              *(long *)(local_e8 + lVar17 * 8 + -8) = lVar22 + 1;
            }
            lVar18 = lVar18 + lVar22 * local_a8[lVar17];
            lVar22 = 0;
            if (*(long *)(local_e8 + lVar17 * 8 + -8) <= hiA[lVar17 + 1] - loA[lVar17 + 1]) {
              lVar22 = *(long *)(local_e8 + lVar17 * 8 + -8);
            }
            *(long *)(local_e8 + lVar17 * 8 + -8) = lVar22;
            lVar17 = lVar17 + 1;
          } while (ndim + -1 != lVar17);
        }
        if (*loA <= *hiA) {
          lVar17 = -1;
          do {
            lVar22 = *(long *)((long)local_150 + lVar17 * 8 + lVar18 * 8 + 8);
            lVar20 = *(long *)((long)local_168 + lVar17 * 8 + lVar18 * 8 + 8);
            lVar19 = lVar22;
            if (lVar22 != lVar20) {
              lVar7 = *(long *)((long)local_160 + lVar17 * 8 + lVar18 * 8 + 8);
              if (lVar22 < lVar20) {
                if ((lVar22 <= lVar7) && (lVar19 = lVar20, lVar7 < lVar20)) {
                  lVar19 = lVar7;
                }
              }
              else if ((lVar22 <= lVar20) || (lVar19 = lVar20, lVar20 <= lVar7)) {
                lVar24 = lVar22;
                if (lVar7 < lVar22) {
                  lVar24 = lVar7;
                }
                lVar19 = lVar22;
                if (lVar20 <= lVar7) {
                  lVar19 = lVar24;
                }
              }
            }
            *(long *)((long)local_158 + lVar17 * 8 + lVar18 * 8 + 8) = lVar19;
            lVar17 = lVar17 + 1;
          } while (lVar17 < *hiA - *loA);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != lVar23);
    }
    break;
  case 2:
    if (0 < lVar23) {
      lVar16 = *hiA;
      lVar18 = *loA;
      lVar17 = 0;
      do {
        if (ndim < 2) {
          lVar22 = 0;
        }
        else {
          lVar20 = 0;
          lVar22 = 0;
          do {
            lVar19 = *(long *)(local_e8 + lVar20 * 8 + -8);
            if ((lVar17 + 1) % local_68[lVar20 + 1] == 0) {
              *(long *)(local_e8 + lVar20 * 8 + -8) = lVar19 + 1;
            }
            lVar22 = lVar22 + lVar19 * local_a8[lVar20];
            lVar19 = 0;
            if (*(long *)(local_e8 + lVar20 * 8 + -8) <= hiA[lVar20 + 1] - loA[lVar20 + 1]) {
              lVar19 = *(long *)(local_e8 + lVar20 * 8 + -8);
            }
            *(long *)(local_e8 + lVar20 * 8 + -8) = lVar19;
            lVar20 = lVar20 + 1;
          } while (ndim + -1 != lVar20);
        }
        if (lVar18 <= lVar16) {
          lVar20 = 0;
          do {
            fVar28 = *(float *)((long)local_150 + lVar20 * 4 + lVar22 * 4);
            fVar29 = *(float *)((long)local_168 + lVar20 * 4 + lVar22 * 4);
            if ((fVar28 != fVar29) || (NAN(fVar28) || NAN(fVar29))) {
              fVar25 = *(float *)((long)local_160 + lVar20 * 4 + lVar22 * 4);
              if (fVar29 <= fVar28) {
                if ((fVar28 <= fVar29) || (fVar29 <= fVar25)) {
                  if ((fVar29 <= fVar25) && (fVar25 <= fVar28)) goto LAB_00129987;
                  goto LAB_00129984;
                }
LAB_001299bb:
                fVar25 = fVar29;
              }
              else {
                if (fVar25 < fVar28) goto LAB_00129984;
                if ((fVar25 < fVar28) || (fVar29 < fVar25)) goto LAB_001299bb;
              }
            }
            else {
LAB_00129984:
              fVar25 = fVar28;
            }
LAB_00129987:
            *(float *)((long)local_158 + lVar20 * 4 + lVar22 * 4) = fVar25;
            lVar20 = lVar20 + 1;
          } while ((lVar16 - lVar18) + 1 != lVar20);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != lVar23);
    }
    break;
  case 3:
    if (0 < lVar23) {
      lVar16 = *hiA;
      lVar18 = *loA;
      lVar17 = 0;
      do {
        if (ndim < 2) {
          lVar22 = 0;
        }
        else {
          lVar20 = 0;
          lVar22 = 0;
          do {
            lVar19 = *(long *)(local_e8 + lVar20 * 8 + -8);
            if ((lVar17 + 1) % local_68[lVar20 + 1] == 0) {
              *(long *)(local_e8 + lVar20 * 8 + -8) = lVar19 + 1;
            }
            lVar22 = lVar22 + lVar19 * local_a8[lVar20];
            lVar19 = 0;
            if (*(long *)(local_e8 + lVar20 * 8 + -8) <= hiA[lVar20 + 1] - loA[lVar20 + 1]) {
              lVar19 = *(long *)(local_e8 + lVar20 * 8 + -8);
            }
            *(long *)(local_e8 + lVar20 * 8 + -8) = lVar19;
            lVar20 = lVar20 + 1;
          } while (ndim + -1 != lVar20);
        }
        if (lVar18 <= lVar16) {
          lVar20 = 0;
          do {
            dVar8 = *(double *)((long)local_150 + lVar20 * 8 + lVar22 * 8);
            dVar32 = *(double *)((long)local_168 + lVar20 * 8 + lVar22 * 8);
            if ((dVar8 != dVar32) || (NAN(dVar8) || NAN(dVar32))) {
              dVar10 = *(double *)((long)local_160 + lVar20 * 8 + lVar22 * 8);
              uVar26 = SUB84(dVar10,0);
              uVar27 = (undefined4)((ulong)dVar10 >> 0x20);
              if (dVar32 <= dVar8) {
                if ((dVar8 <= dVar32) || (dVar32 <= dVar10)) {
                  if ((dVar32 <= dVar10) && (dVar10 <= dVar8)) goto LAB_00129de6;
                  goto LAB_00129de2;
                }
LAB_00129e20:
                uVar26 = SUB84(dVar32,0);
                uVar27 = (undefined4)((ulong)dVar32 >> 0x20);
              }
              else {
                if (dVar10 < dVar8) goto LAB_00129de2;
                if ((dVar10 < dVar8) || (dVar32 < dVar10)) goto LAB_00129e20;
              }
            }
            else {
LAB_00129de2:
              uVar26 = SUB84(dVar8,0);
              uVar27 = (int)((ulong)dVar8 >> 0x20);
            }
LAB_00129de6:
            *(ulong *)((long)local_158 + lVar20 * 8 + lVar22 * 8) = CONCAT44(uVar27,uVar26);
            lVar20 = lVar20 + 1;
          } while ((lVar16 - lVar18) + 1 != lVar20);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != lVar23);
    }
    break;
  default:
    pnga_error("median: wrong data type",type);
    return;
  case 5:
    if (0 < lVar23) {
      lVar16 = 0;
      local_c0 = ndim + -1;
      do {
        lVar18 = local_c0;
        local_b8 = lVar16;
        if (ndim < 2) {
          lVar17 = 0;
        }
        else {
          lVar22 = 0;
          lVar17 = 0;
          do {
            lVar20 = *(long *)(local_e8 + lVar22 * 8 + -8);
            if ((lVar16 + 1) % local_68[lVar22 + 1] == 0) {
              *(long *)(local_e8 + lVar22 * 8 + -8) = lVar20 + 1;
            }
            lVar17 = lVar17 + lVar20 * local_a8[lVar22];
            lVar20 = 0;
            if (*(long *)(local_e8 + lVar22 * 8 + -8) <= hiA[lVar22 + 1] - loA[lVar22 + 1]) {
              lVar20 = *(long *)(local_e8 + lVar22 * 8 + -8);
            }
            *(long *)(local_e8 + lVar22 * 8 + -8) = lVar20;
            lVar22 = lVar22 + 1;
          } while (lVar18 != lVar22);
        }
        if (*loA <= *hiA) {
          lVar16 = -1;
          do {
            uVar2 = *(undefined8 *)((long)local_150 + lVar16 * 8 + lVar17 * 8 + 8);
            fVar28 = (float)uVar2;
            fVar29 = (float)((ulong)uVar2 >> 0x20);
            uVar2 = *(undefined8 *)((long)local_168 + lVar16 * 8 + lVar17 * 8 + 8);
            uVar3 = *(undefined8 *)((long)local_160 + lVar16 * 8 + lVar17 * 8 + 8);
            dVar8 = (double)(fVar28 * fVar28 + fVar29 * fVar29);
            if (dVar8 < 0.0) {
              dVar8 = sqrt(dVar8);
            }
            else {
              dVar8 = SQRT(dVar8);
            }
            local_148 = (float)uVar2;
            fStack_144 = (float)((ulong)uVar2 >> 0x20);
            dVar32 = (double)(local_148 * local_148 + fStack_144 * fStack_144);
            if (dVar32 < 0.0) {
              dVar32 = sqrt(dVar32);
            }
            else {
              dVar32 = SQRT(dVar32);
            }
            local_118 = (float)uVar3;
            fStack_114 = (float)((ulong)uVar3 >> 0x20);
            dVar10 = (double)(local_118 * local_118 + fStack_114 * fStack_114);
            if (dVar10 < 0.0) {
              local_b0 = dVar32;
              dVar10 = sqrt(dVar10);
              dVar32 = local_b0;
            }
            else {
              dVar10 = SQRT(dVar10);
            }
            if ((dVar8 != dVar32) || (NAN(dVar8) || NAN(dVar32))) {
              if (dVar32 <= dVar8) {
                if (((dVar8 <= dVar32) ||
                    (fVar25 = local_148, fVar30 = fStack_144, dVar32 <= dVar10)) &&
                   ((dVar10 < dVar32 || (fVar25 = local_118, fVar30 = fStack_114, dVar8 < dVar10))))
                goto LAB_0012a008;
              }
              else {
                fVar25 = fVar28;
                fVar30 = fVar29;
                if ((dVar8 <= dVar10) &&
                   ((dVar10 < dVar8 || (fVar25 = local_118, fVar30 = fStack_114, dVar32 < dVar10))))
                {
                  fVar25 = local_148;
                  fVar30 = fStack_144;
                }
              }
            }
            else {
LAB_0012a008:
              fVar25 = fVar28;
              fVar30 = fVar29;
            }
            *(ulong *)((long)local_158 + lVar16 * 8 + lVar17 * 8 + 8) = CONCAT44(fVar30,fVar25);
            lVar16 = lVar16 + 1;
          } while (lVar16 < *hiA - *loA);
        }
        lVar16 = local_b8 + 1;
      } while (lVar16 != lVar23);
    }
    break;
  case 6:
    if (0 < lVar23) {
      lVar16 = 0;
      do {
        if (ndim < 2) {
          lVar18 = 0;
        }
        else {
          lVar17 = 0;
          lVar18 = 0;
          do {
            lVar22 = *(long *)(local_e8 + lVar17 * 8 + -8);
            if ((lVar16 + 1) % local_68[lVar17 + 1] == 0) {
              *(long *)(local_e8 + lVar17 * 8 + -8) = lVar22 + 1;
            }
            lVar18 = lVar18 + lVar22 * local_a8[lVar17];
            lVar22 = 0;
            if (*(long *)(local_e8 + lVar17 * 8 + -8) <= hiA[lVar17 + 1] - loA[lVar17 + 1]) {
              lVar22 = *(long *)(local_e8 + lVar17 * 8 + -8);
            }
            *(long *)(local_e8 + lVar17 * 8 + -8) = lVar22;
            lVar17 = lVar17 + 1;
          } while (ndim + -1 != lVar17);
        }
        if (*loA <= *hiA) {
          lVar18 = lVar18 << 4;
          lVar17 = -1;
          do {
            dVar32 = *(double *)((long)local_150 + lVar18);
            dVar10 = ((double *)((long)local_150 + lVar18))[1];
            dVar12 = *(double *)((long)local_168 + lVar18);
            dVar13 = ((double *)((long)local_168 + lVar18))[1];
            dVar14 = *(double *)((long)local_160 + lVar18);
            dVar15 = ((double *)((long)local_160 + lVar18))[1];
            dVar8 = dVar32 * dVar32 + dVar10 * dVar10;
            if (dVar8 < 0.0) {
              dVar8 = sqrt(dVar8);
            }
            else {
              dVar8 = SQRT(dVar8);
            }
            dVar31 = dVar12 * dVar12 + dVar13 * dVar13;
            if (dVar31 < 0.0) {
              dVar31 = sqrt(dVar31);
            }
            else {
              dVar31 = SQRT(dVar31);
            }
            dVar9 = dVar14 * dVar14 + dVar15 * dVar15;
            if (dVar9 < 0.0) {
              dVar9 = sqrt(dVar9);
            }
            else {
              dVar9 = SQRT(dVar9);
            }
            local_128 = SUB84(dVar32,0);
            uStack_124 = (undefined4)((ulong)dVar32 >> 0x20);
            uStack_120 = SUB84(dVar10,0);
            uStack_11c = (undefined4)((ulong)dVar10 >> 0x20);
            if ((dVar8 != dVar31) || (NAN(dVar8) || NAN(dVar31))) {
              local_118 = SUB84(dVar14,0);
              fStack_114 = (float)((ulong)dVar14 >> 0x20);
              uStack_110 = SUB84(dVar15,0);
              uStack_10c = (undefined4)((ulong)dVar15 >> 0x20);
              local_148 = SUB84(dVar12,0);
              fStack_144 = (float)((ulong)dVar12 >> 0x20);
              uStack_140 = SUB84(dVar13,0);
              uStack_13c = (undefined4)((ulong)dVar13 >> 0x20);
              if (dVar31 <= dVar8) {
                if (((dVar8 <= dVar31) ||
                    (fVar28 = local_148, fVar29 = fStack_144, uVar26 = uStack_140,
                    uVar27 = uStack_13c, dVar31 <= dVar9)) &&
                   ((dVar9 < dVar31 ||
                    (fVar28 = local_118, fVar29 = fStack_114, uVar26 = uStack_110,
                    uVar27 = uStack_10c, dVar8 < dVar9)))) goto LAB_00129b55;
              }
              else {
                fVar28 = (float)local_128;
                fVar29 = (float)uStack_124;
                uVar26 = uStack_120;
                uVar27 = uStack_11c;
                if ((dVar8 <= dVar9) &&
                   ((dVar9 < dVar8 ||
                    (fVar28 = local_118, fVar29 = fStack_114, uVar26 = uStack_110,
                    uVar27 = uStack_10c, dVar31 < dVar9)))) {
                  fVar28 = local_148;
                  fVar29 = fStack_144;
                  uVar26 = uStack_140;
                  uVar27 = uStack_13c;
                }
              }
            }
            else {
LAB_00129b55:
              fVar28 = (float)local_128;
              fVar29 = (float)uStack_124;
              uVar26 = uStack_120;
              uVar27 = uStack_11c;
            }
            puVar1 = (undefined4 *)((long)local_158 + lVar18);
            *puVar1 = fVar28;
            puVar1[1] = fVar29;
            puVar1[2] = uVar26;
            puVar1[3] = uVar27;
            lVar17 = lVar17 + 1;
            lVar18 = lVar18 + 0x10;
          } while (lVar17 < *hiA - *loA);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != lVar23);
    }
  }
  return;
}

Assistant:

static void sgai_median_patch_values(Integer type, Integer ndim, Integer *loA,
                              Integer *hiA, Integer *ldA, void *A_ptr,
                              void *B_ptr, void *C_ptr, void *M_ptr,
                              Integer offset)
{
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseldA[MAXDIM];
  Integer idx, n1dim;
  Integer i, j;

  double na, nb, nc;            /*norm of a, norm of b, norm of c */
  int ia, ib, ic, im;
  float fa, fb, fc, fm;
  double da, db, dc, dm;
  long la, lb, lc, lm;
  DoubleComplex za, zb, zc, zm;
  SingleComplex ca, cb, cc, cm;

  /* number of n-element of the first dimension */
  n1dim = 1;
  for (i = 1; i < ndim; i++)
    n1dim *= (hiA[i] - loA[i] + 1);

  /* calculate the destination indices */
  bvalue[0] = 0;
  bvalue[1] = 0;
  bunit[0] = 1;
  bunit[1] = 1;
  /* baseldA[0] = ldA[0]
   * baseldA[1] = ldA[0] * ldA[1]
   * baseldA[2] = ldA[0] * ldA[1] * ldA[2] .....
   */
  baseldA[0] = ldA[0];
  baseldA[1] = baseldA[0] * ldA[1];
  for (i = 2; i < ndim; i++)
  {
    bvalue[i] = 0;
    bunit[i] = bunit[i - 1] * (hiA[i - 1] - loA[i - 1] + 1);
    baseldA[i] = baseldA[i - 1] * ldA[i];
  }
  switch(type) {
    case C_DBL:
      A_ptr = (void*)((double*)(A_ptr) + offset);
      B_ptr = (void*)((double*)(B_ptr) + offset);
      C_ptr = (void*)((double*)(C_ptr) + offset);
      M_ptr = (void*)((double*)(M_ptr) + offset);
      break;
    case C_INT:
      A_ptr = (void*)((int*)(A_ptr) + offset);
      B_ptr = (void*)((int*)(B_ptr) + offset);
      C_ptr = (void*)((int*)(C_ptr) + offset);
      M_ptr = (void*)((int*)(M_ptr) + offset);
      break;
    case C_DCPL:
      A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
      B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
      C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
      M_ptr = (void*)((DoubleComplex*)(M_ptr) + offset);
      break;
    case C_SCPL:
      A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
      B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
      C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
      M_ptr = (void*)((SingleComplex*)(M_ptr) + offset);
      break;
    case C_FLOAT:
      A_ptr = (void*)((float*)(A_ptr) + offset);
      B_ptr = (void*)((float*)(B_ptr) + offset);
      C_ptr = (void*)((float*)(C_ptr) + offset);
      M_ptr = (void*)((float*)(M_ptr) + offset);
      break;
    case C_LONG:
      A_ptr = (void*)((long*)(A_ptr) + offset);
      B_ptr = (void*)((long*)(B_ptr) + offset);
      C_ptr = (void*)((long*)(C_ptr) + offset);
      M_ptr = (void*)((long*)(M_ptr) + offset);
      break;
    case C_LONGLONG:
      A_ptr = (void*)((long long*)(A_ptr) + offset);
      B_ptr = (void*)((long long*)(B_ptr) + offset);
      C_ptr = (void*)((long long*)(C_ptr) + offset);
      M_ptr = (void*)((long long*)(M_ptr) + offset);
      break;
    default:
      break;
  }

  /*compute elementwise median */

  switch (type) {

    case C_INT: 
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          ia = ((int *) A_ptr)[idx + j];
          ib = ((int *) B_ptr)[idx + j];
          ic = ((int *) C_ptr)[idx + j];
          median(ia, ib, ic, im);
          ((int *) M_ptr)[idx + j] = im;
        }
      }
      break;
    case C_LONG: 
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          la = ((long *) A_ptr)[idx + j];
          lb = ((long *) B_ptr)[idx + j];
          lc = ((long *) C_ptr)[idx + j];
          median(la, lb, lc, lm);
          ((long *) M_ptr)[idx + j] = lm;
        }
      }
      break;
    case C_FLOAT: 
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          fa = ((float *) A_ptr)[idx + j];
          fb = ((float *) B_ptr)[idx + j];
          fc = ((float *) C_ptr)[idx + j];
          median(fa, fb, fc, fm);
          ((float *) M_ptr)[idx + j] = fm;
        }
      }
      break;
    case C_DBL: 
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          da = ((double *) A_ptr)[idx + j];
          db = ((double *) B_ptr)[idx + j];
          dc = ((double *) C_ptr)[idx + j];
          median(da, db, dc, dm);
          ((double *) M_ptr)[idx + j] = dm;
        }
      }
      break;
    case C_DCPL:
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          za = ((DoubleComplex *) A_ptr)[idx + j];
          zb = ((DoubleComplex *) B_ptr)[idx + j];
          zc = ((DoubleComplex *) C_ptr)[idx + j];
          na = sqrt ((za.real) * (za.real) + (za.imag) * (za.imag));
          nb = sqrt ((zb.real) * (zb.real) + (zb.imag) * (zb.imag));
          nc = sqrt ((zc.real) * (zc.real) + (zc.imag) * (zc.imag));
          median_dcpl(na, nb, nc, za, zb, zc, zm);
          ((DoubleComplex *) M_ptr)[idx + j] = zm;
        }
      }
      break;

    case C_SCPL:
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          ca = ((SingleComplex *) A_ptr)[idx + j];
          cb = ((SingleComplex *) B_ptr)[idx + j];
          cc = ((SingleComplex *) C_ptr)[idx + j];
          na = sqrt ((ca.real) * (ca.real) + (ca.imag) * (ca.imag));
          nb = sqrt ((cb.real) * (cb.real) + (cb.imag) * (cb.imag));
          nc = sqrt ((cc.real) * (cc.real) + (cc.imag) * (cc.imag));
          median_scpl(na, nb, nc, ca, cb, cc, cm);
          ((SingleComplex *) M_ptr)[idx + j] = cm;
        }
      }
      break;
    default:
      pnga_error("median: wrong data type", type);
  }
}